

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

App * __thiscall
CLI::App::add_subcommand(App *this,string *subcommand_name,string *subcommand_description)

{
  byte bVar1;
  byte bVar2;
  size_type sVar3;
  byte *pbVar4;
  pointer pcVar5;
  App *pAVar6;
  IncorrectConstruction *pIVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  size_type sVar10;
  App_p subcom;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  App_p local_88;
  string local_70;
  string local_50;
  
  sVar3 = subcommand_name->_M_string_length;
  if (sVar3 == 0) {
LAB_0023a7cb:
    local_108._M_dataplus._M_p = (pointer)operator_new(0x360);
    local_e8._M_dataplus._M_p = (subcommand_description->_M_dataplus)._M_p;
    paVar9 = &subcommand_description->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p == paVar9) {
      local_e8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_e8.field_2._8_4_ = *(undefined4 *)((long)&subcommand_description->field_2 + 8);
      local_e8.field_2._12_4_ = *(undefined4 *)((long)&subcommand_description->field_2 + 0xc);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    }
    else {
      local_e8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_e8._M_string_length = subcommand_description->_M_string_length;
    (subcommand_description->_M_dataplus)._M_p = (pointer)paVar9;
    subcommand_description->_M_string_length = 0;
    (subcommand_description->field_2)._M_local_buf[0] = '\0';
    pcVar5 = (subcommand_name->_M_dataplus)._M_p;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar5,pcVar5 + subcommand_name->_M_string_length);
    App((App *)local_108._M_dataplus._M_p,&local_e8,&local_c8,this);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CLI::App*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_108._M_string_length,
               (App *)local_108._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    local_88.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_108._M_dataplus._M_p;
    local_88.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length;
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    pAVar6 = add_subcommand(this,&local_88);
    if (local_88.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length);
    }
    return pAVar6;
  }
  pbVar4 = (byte *)(subcommand_name->_M_dataplus)._M_p;
  bVar1 = *pbVar4;
  if (0x21 < bVar1 && bVar1 != 0x2d) {
    sVar10 = 1;
    do {
      if (sVar3 == sVar10) goto LAB_0023a7cb;
      bVar2 = pbVar4[sVar10];
    } while ((((bVar2 != 0x3a) && (bVar2 != 0x3d)) && (bVar2 != 0x7b)) &&
            (sVar10 = sVar10 + 1, bVar2 == 9 || 0x20 < bVar2));
    if (0x21 < bVar1 && bVar1 != 0x2d) {
      sVar10 = 0;
      do {
        bVar1 = pbVar4[sVar10];
        if (((bVar1 == 0x3a) || (bVar1 == 0x3d)) ||
           ((bVar1 == 0x7b || (bVar1 != 9 && bVar1 < 0x21)))) {
          pIVar7 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"Subcommand name contains invalid character (\'","");
          ::std::operator+(&local_108,&local_a8,bVar1);
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_108,
                          "\'), all characters are allowed except\'=\',\':\',\'{\',\'}\', \' \', and control characters"
                         );
          local_70._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
          paVar9 = &pbVar8->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p == paVar9) {
            local_70.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          }
          else {
            local_70.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          }
          local_70._M_string_length = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          CLI::IncorrectConstruction::IncorrectConstruction(pIVar7,&local_70);
          __cxa_throw(pIVar7,&CLI::IncorrectConstruction::typeinfo,Error::~Error);
        }
        sVar10 = sVar10 + 1;
      } while (sVar3 != sVar10);
      goto LAB_0023a7cb;
    }
  }
  pIVar7 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "Subcommand name starts with invalid character, \'!\' and \'-\' and control characters"
             ,"");
  CLI::IncorrectConstruction::IncorrectConstruction(pIVar7,&local_50);
  __cxa_throw(pIVar7,&CLI::IncorrectConstruction::typeinfo,Error::~Error);
}

Assistant:

CLI11_INLINE App *App::add_subcommand(std::string subcommand_name, std::string subcommand_description) {
    if(!subcommand_name.empty() && !detail::valid_name_string(subcommand_name)) {
        if(!detail::valid_first_char(subcommand_name[0])) {
            throw IncorrectConstruction(
                "Subcommand name starts with invalid character, '!' and '-' and control characters");
        }
        for(auto c : subcommand_name) {
            if(!detail::valid_later_char(c)) {
                throw IncorrectConstruction(std::string("Subcommand name contains invalid character ('") + c +
                                            "'), all characters are allowed except"
                                            "'=',':','{','}', ' ', and control characters");
            }
        }
    }
    CLI::App_p subcom = std::shared_ptr<App>(new App(std::move(subcommand_description), subcommand_name, this));
    return add_subcommand(std::move(subcom));
}